

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool run_container_equals_array(run_container_t *container1,array_container_t *container2)

{
  ushort uVar1;
  _Bool _Var2;
  int iVar3;
  int32_t n_runs;
  long lVar4;
  long lVar5;
  uint uVar6;
  
  lVar4 = cpuid_Extended_Feature_Enumeration_info(7);
  if ((*(uint *)(lVar4 + 4) & 0x20) == 0) {
    iVar3 = container1->n_runs;
    lVar4 = (long)iVar3;
    if (0 < lVar4) {
      lVar5 = 0;
      do {
        iVar3 = iVar3 + (uint)container1->runs[lVar5].length;
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
    }
  }
  else {
    iVar3 = _avx2_run_container_cardinality(container1);
  }
  if (iVar3 == container2->cardinality) {
    _Var2 = true;
    if (0 < (long)container1->n_runs) {
      lVar4 = 0;
      iVar3 = 0;
      do {
        uVar1 = container1->runs[lVar4].value;
        if ((container2->array[iVar3] != uVar1) ||
           (uVar6 = (uint)container1->runs[lVar4].length,
           uVar1 + uVar6 != (uint)container2->array[iVar3 + uVar6])) goto LAB_0010d238;
        iVar3 = iVar3 + uVar6 + 1;
        lVar4 = lVar4 + 1;
      } while (container1->n_runs != lVar4);
    }
  }
  else {
LAB_0010d238:
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

bool run_container_equals_array(const run_container_t* container1,
                                const array_container_t* container2) {
    if (run_container_cardinality(container1) != container2->cardinality)
        return false;
    int32_t pos = 0;
    for (int i = 0; i < container1->n_runs; ++i) {
        const uint32_t run_start = container1->runs[i].value;
        const uint32_t le = container1->runs[i].length;

        if (container2->array[pos] != run_start) {
            return false;
        }

        if (container2->array[pos + le] != run_start + le) {
            return false;
        }

        pos += le + 1;
    }
    return true;
}